

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::AddAllocatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,Message *new_entry)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  Reflection *in_RCX;
  FieldDescriptor *in_RDX;
  Reflection *in_RDI;
  RepeatedPtrFieldBase *repeated;
  char *in_stack_00000058;
  char *in_stack_00000060;
  undefined4 in_stack_00000068;
  CppType in_stack_0000006c;
  Descriptor *in_stack_00000070;
  FieldDescriptor *in_stack_00000078;
  Descriptor *in_stack_00000080;
  Type *in_stack_ffffffffffffffc8;
  FieldDescriptor *in_stack_ffffffffffffffd8;
  Message *message_00;
  
  pDVar4 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar4 != in_RDI->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x408f7f);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_00000080,in_stack_00000078,(char *)in_stack_00000070,in_stack_0000006c);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    MutableExtensionSet(in_RDI,in_stack_ffffffffffffffc8);
    internal::ExtensionSet::AddAllocatedMessage
              ((ExtensionSet *)in_RCX,in_stack_ffffffffffffffd8,(MessageLite *)in_RDI);
  }
  else {
    message_00 = (Message *)0x0;
    bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x408fe8);
    if (bVar1) {
      MutableRaw<google::protobuf::internal::MapFieldBase>
                (in_RCX,message_00,(FieldDescriptor *)in_RDI);
      internal::MapFieldBase::MutableRepeatedField((MapFieldBase *)in_RDI);
    }
    else {
      MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                (in_RCX,message_00,(FieldDescriptor *)in_RDI);
    }
    internal::RepeatedPtrFieldBase::
    AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              ((RepeatedPtrFieldBase *)in_RDI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void Reflection::AddAllocatedMessage(Message* message,
                                     const FieldDescriptor* field,
                                     Message* new_entry) const {
  USAGE_CHECK_ALL(AddAllocatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->AddAllocatedMessage(field, new_entry);
  } else {
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    repeated->AddAllocated<GenericTypeHandler<Message> >(new_entry);
  }
}